

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.c
# Opt level: O0

void ASN1_STRING_TABLE_cleanup(void)

{
  stack_st_ASN1_STRING_TABLE *sk;
  OPENSSL_STACK *st;
  stack_st_ASN1_STRING_TABLE *tmp;
  OPENSSL_sk_freefunc in_stack_ffffffffffffffe8;
  
  sk = stable;
  if (stable != (stack_st_ASN1_STRING_TABLE *)0x0) {
    stable = (stack_st_ASN1_STRING_TABLE *)0x0;
    st = ossl_check_ASN1_STRING_TABLE_sk_type(sk);
    ossl_check_ASN1_STRING_TABLE_freefunc_type(st_free);
    OPENSSL_sk_pop_free(st,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void ASN1_STRING_TABLE_cleanup(void)
{
    STACK_OF(ASN1_STRING_TABLE) *tmp;

    tmp = stable;
    if (tmp == NULL)
        return;
    stable = NULL;
    sk_ASN1_STRING_TABLE_pop_free(tmp, st_free);
}